

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

void google::protobuf::anon_unknown_21::CollectEditions
               (Descriptor *descriptor,Edition maximum_edition,
               btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
               *editions)

{
  int iVar1;
  FieldOptions *pFVar2;
  long lVar3;
  undefined1 *puVar4;
  Rep *pRVar5;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar6;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this;
  Edition local_5c;
  Descriptor *local_58;
  long local_50;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>,_bool>
  local_48;
  
  if (0 < descriptor->field_count_) {
    local_50 = 0;
    local_58 = descriptor;
    do {
      pFVar2 = local_58->fields_[local_50].options_;
      puVar4 = (undefined1 *)(pFVar2->field_0)._impl_.feature_support_;
      if ((FieldOptions_FeatureSupport *)puVar4 == (FieldOptions_FeatureSupport *)0x0) {
        puVar4 = _FieldOptions_FeatureSupport_default_instance_;
      }
      local_5c = (((FieldOptions_FeatureSupport *)puVar4)->field_0)._impl_.edition_introduced_;
      if ((int)local_5c <= (int)maximum_edition) {
        absl::lts_20250127::container_internal::
        btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
        ::insert_unique<google::protobuf::Edition,google::protobuf::Edition_const&>
                  (&local_48,
                   (btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
                    *)editions,&local_5c,&local_5c);
      }
      puVar4 = (undefined1 *)(pFVar2->field_0)._impl_.feature_support_;
      if ((FieldOptions_FeatureSupport *)puVar4 == (FieldOptions_FeatureSupport *)0x0) {
        puVar4 = _FieldOptions_FeatureSupport_default_instance_;
      }
      if (((undefined1  [32])
           ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar4)->field_0 &
           (undefined1  [32])0x8) != (undefined1  [32])0x0) &&
         (local_5c = (((FieldOptions_FeatureSupport *)puVar4)->field_0)._impl_.edition_removed_,
         (int)local_5c <= (int)maximum_edition)) {
        absl::lts_20250127::container_internal::
        btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
        ::insert_unique<google::protobuf::Edition,google::protobuf::Edition_const&>
                  (&local_48,
                   (btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
                    *)editions,&local_5c,&local_5c);
      }
      this = &(pFVar2->field_0)._impl_.edition_defaults_;
      pRVar6 = this;
      if ((*(byte *)((long)&pFVar2->field_0 + 0x30) & 1) != 0) {
        pRVar5 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
        pRVar6 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)pRVar5->elements
        ;
      }
      if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar5 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
        this = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)pRVar5->elements;
      }
      lVar3 = local_50;
      iVar1 = *(int *)((long)&pFVar2->field_0 + 0x38);
      for (; pRVar6 != (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                       (&(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
          pRVar6 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                   &(pRVar6->super_RepeatedPtrFieldBase).current_size_) {
        local_5c = *(Edition *)
                    ((long)(pRVar6->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + 0x20);
        if ((int)local_5c <= (int)maximum_edition) {
          absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
          ::insert_unique<google::protobuf::Edition,google::protobuf::Edition_const&>
                    (&local_48,
                     (btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
                      *)editions,&local_5c,&local_5c);
        }
      }
      local_50 = lVar3 + 1;
    } while (local_50 < local_58->field_count_);
  }
  return;
}

Assistant:

void CollectEditions(const Descriptor& descriptor, Edition maximum_edition,
                     absl::btree_set<Edition>& editions) {
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldOptions& options = descriptor.field(i)->options();
    // Editions where a new feature is introduced should be captured.
    MaybeInsertEdition(options.feature_support().edition_introduced(),
                       maximum_edition, editions);

    // Editions where a feature is removed should be captured.
    if (options.feature_support().has_edition_removed()) {
      MaybeInsertEdition(options.feature_support().edition_removed(),
                         maximum_edition, editions);
    }

    // Any edition where a default value changes should be captured.
    for (const auto& def : options.edition_defaults()) {
      MaybeInsertEdition(def.edition(), maximum_edition, editions);
    }
  }
}